

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  bool bVar7;
  _func_int **__first;
  char cVar8;
  uint uVar9;
  buffer_appender<char> bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  buffer<char> *buf;
  uint uVar15;
  undefined1 auVar16 [8];
  ulong uVar17;
  uint uVar18;
  char *pcVar19;
  int iVar20;
  _Alloc_hider _Var21;
  ulong n;
  uint uVar22;
  undefined1 local_2b0 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char digits [40];
  undefined1 local_60 [8];
  string groups;
  
  grouping_impl<char>((string *)local_60,(locale_ref)(this->locale).locale_);
  if (groups._M_dataplus._M_p == (pointer)0x0) {
    on_dec(this);
    goto LAB_0023106d;
  }
  cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar8 == '\0') {
    on_dec(this);
    goto LAB_0023106d;
  }
  uVar15 = this->abs_value;
  uVar11 = 0x1f;
  if ((uVar15 | 1) != 0) {
    for (; (uVar15 | 1) >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  uVar4 = *(ushort *)(basic_data<void>::bsr2log10 + (ulong)uVar11 * 2);
  bVar7 = uVar15 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar4 * 4);
  uVar22 = (uint)uVar4 - (uint)bVar7;
  auVar16 = local_60;
  uVar9 = uVar22;
  uVar11 = uVar22;
  if (groups._M_dataplus._M_p == (pointer)0x0) {
LAB_00230e10:
    uVar12 = uVar11;
    uVar18 = uVar9;
    if (auVar16 == (undefined1  [8])((long)local_60 + (long)groups._M_dataplus._M_p))
    goto LAB_00230e1b;
  }
  else {
    uVar18 = (int)groups._M_dataplus._M_p + uVar22;
    _Var21 = groups._M_dataplus;
    do {
      cVar2 = *(char *)auVar16;
      uVar12 = uVar11 - (int)cVar2;
      if ((uVar12 == 0 || (int)uVar11 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_00230e10;
      uVar9 = uVar9 + 1;
      auVar16 = (undefined1  [8])((long)auVar16 + 1);
      _Var21._M_p = _Var21._M_p + -1;
      uVar11 = uVar12;
    } while (_Var21._M_p != (pointer)0x0);
LAB_00230e1b:
    uVar18 = (int)(uVar12 - 1) / (int)((char *)((long)local_60 + (long)groups._M_dataplus._M_p))[-1]
             + uVar18;
  }
  pcVar14 = digits + (long)(int)uVar22 + -8;
  uVar11 = uVar15;
  if (99 < uVar15) {
    do {
      uVar11 = uVar15 / 100;
      *(undefined2 *)(pcVar14 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar15 % 100) * 2);
      pcVar14 = pcVar14 + -2;
      bVar6 = 9999 < uVar15;
      uVar15 = uVar15 / 100;
    } while (bVar6);
  }
  if (uVar11 < 10) {
    pcVar14[-1] = (byte)uVar11 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar14 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar11 * 2);
  }
  buffer.super_buffer<char>._vptr_buffer = (_func_int **)&buffer.super_buffer<char>.capacity_;
  buffer.super_buffer<char>.ptr_ = (char *)0x0;
  groups.field_2._8_8_ = &PTR_grow_002b1bd8;
  local_2b0 = (undefined1  [8])&PTR_grow_002b1bd8;
  buffer.super_buffer<char>.size_ = 500;
  uVar18 = uVar18 + this->prefix_size;
  if (-1 < (int)uVar18) {
    pcVar14 = (char *)(ulong)uVar18;
    if (500 < uVar18) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2b0,
                 (size_t)pcVar14);
    }
    __first = buffer.super_buffer<char>._vptr_buffer;
    buffer.super_buffer<char>.ptr_ = (char *)buffer.super_buffer<char>.size_;
    if (pcVar14 <= buffer.super_buffer<char>.size_) {
      buffer.super_buffer<char>.ptr_ = pcVar14;
    }
    pcVar19 = (char *)((long)buffer.super_buffer<char>._vptr_buffer + (long)pcVar14);
    if (0 < (int)uVar22) {
      uVar17 = (ulong)uVar22;
      iVar20 = ((uint)uVar4 - (uint)bVar7) + 1;
      iVar13 = 0;
      auVar16 = local_60;
      do {
        uVar17 = uVar17 - 1;
        pcVar1 = pcVar19 + -1;
        pcVar19[-1] = digits[(uVar17 & 0xffffffff) - 8];
        cVar2 = *(char *)auVar16;
        if ('\0' < cVar2) {
          iVar13 = iVar13 + 1;
          if ((cVar2 != '\x7f') && (iVar13 % (int)cVar2 == 0)) {
            if ((char *)((long)auVar16 + 1) !=
                (char *)((long)local_60 + (long)groups._M_dataplus._M_p)) {
              iVar13 = 0;
              auVar16 = (undefined1  [8])((long)auVar16 + 1);
            }
            pcVar19[-2] = cVar8;
            pcVar1 = pcVar19 + -2;
          }
        }
        pcVar19 = pcVar1;
        iVar20 = iVar20 + -1;
      } while (1 < iVar20);
    }
    if (this->prefix_size != 0) {
      pcVar19[-1] = '-';
    }
    pbVar5 = this->specs;
    pcVar19 = (char *)(long)pbVar5->width;
    if (-1 < (long)pcVar19) {
      uVar17 = 0;
      if (pcVar14 <= pcVar19) {
        uVar17 = (long)pcVar19 - (long)pcVar14;
      }
      bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar5->field_0x9 & 0xf));
      if (*(char **)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          pcVar14 + (pbVar5->fill).size_ * uVar17 +
                    *(long *)((long)bVar10.
                                    super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 0x10)) {
        (*(code *)**(undefined8 **)
                    bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      n = uVar17 >> (bVar3 & 0x3f);
      bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,n,&pbVar5->fill);
      bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         ((char *)__first,pcVar14 + (long)__first,bVar10);
      bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar17 - n,&pbVar5->fill);
      (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_2b0 = (undefined1  [8])groups.field_2._8_8_;
      if (buffer.super_buffer<char>._vptr_buffer !=
          (_func_int **)&buffer.super_buffer<char>.capacity_) {
        operator_delete(buffer.super_buffer<char>._vptr_buffer,buffer.super_buffer<char>.size_);
      }
LAB_0023106d:
      if (local_60 != (undefined1  [8])&groups._M_string_length) {
        operator_delete((void *)local_60,groups._M_string_length + 1);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
              ,0x13c,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    buffer.resize(to_unsigned(size));
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    using iterator = remove_reference_t<decltype(reserve(out, 0))>;
    auto data = buffer.data();
    out = write_padded<align::right>(out, specs, size, size, [=](iterator it) {
      return copy_str<Char>(data, data + size, it);
    });
  }